

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  int __val;
  long lVar1;
  PyObject *pPVar2;
  string *in_RDI;
  PyTypeObject *pPVar3;
  error_scope scope;
  error_scope local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  handle local_140;
  handle local_138;
  undefined1 local_130 [24];
  object local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = PyErr_Occurred();
  if (lVar1 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"Unknown internal error occurred",(allocator<char> *)&local_160);
  }
  else {
    error_scope::error_scope(&local_178);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    if (local_178.type != (PyObject *)0x0) {
      local_130._8_8_ = local_178.type;
      local_130._16_8_ = "__name__";
      local_118.super_handle.m_ptr = (handle)(PyObject *)0x0;
      accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                (&local_160,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_130);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string((string *)&local_160);
      object::~object(&local_118);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (local_178.value != (PyObject *)0x0) {
      local_130._0_8_ = PyObject_Str();
      str::operator_cast_to_string(&local_160,(str *)local_130);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string((string *)&local_160);
      object::~object((object *)local_130);
    }
    PyErr_NormalizeException(&local_178,&local_178.value,&local_178.trace);
    if (local_178.trace != (PyObject *)0x0) {
      PyException_SetTraceback(local_178.value);
      if (local_178.trace != (PyObject *)0x0) {
        do {
          pPVar2 = local_178.trace;
          local_178.trace = (PyObject *)pPVar2[1].ob_refcnt;
        } while (local_178.trace != (PyObject *)0x0);
        pPVar3 = pPVar2[1].ob_type;
        std::__cxx11::string::append((char *)in_RDI);
        for (; pPVar3 != (PyTypeObject *)0x0; pPVar3 = (PyTypeObject *)pPVar3->tp_name) {
          __val = PyFrame_GetLineNumber(pPVar3);
          local_138.m_ptr = *(PyObject **)(pPVar3->tp_basicsize + 0x68);
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_90,&local_138);
          std::operator+(&local_50,"  ",&local_90);
          std::operator+(&local_110,&local_50,"(");
          std::__cxx11::to_string(&local_b0,__val);
          std::operator+(&local_70,&local_110,&local_b0);
          std::operator+(&local_f0,&local_70,"): ");
          local_140.m_ptr = *(PyObject **)(pPVar3->tp_basicsize + 0x70);
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_d0,&local_140);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130,&local_f0,&local_d0);
          std::operator+(&local_160,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130,"\n");
          std::__cxx11::string::append((string *)in_RDI);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)local_130);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
    }
    error_scope::~error_scope(&local_178);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
        trace = trace->tb_next;
    }
#endif

    return errorString;
}